

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

SparseArraySegmentBase * __thiscall
Js::JavascriptArray::GetBeginLookupSegment(JavascriptArray *this,uint32 index,bool useSegmentMap)

{
  Type TVar1;
  DynamicObjectFlags DVar2;
  SegmentBTreeRoot *this_00;
  Type *pTVar3;
  Type TVar4;
  Type local_38;
  SparseArraySegmentBase *matchOrNextSeg;
  SparseArraySegmentBase *seg;
  
  matchOrNextSeg = (SparseArraySegmentBase *)0x0;
  DVar2 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  pTVar3 = (Type *)((long)this->segmentUnion + 0x20);
  if ((DVar2 & HasSegmentMap) == None) {
    pTVar3 = &this->segmentUnion;
  }
  TVar4 = *pTVar3;
  if ((TVar4 == (Type)0x0) || (index < *(uint *)TVar4)) {
    TVar4 = (Type)0x0;
  }
  else {
    matchOrNextSeg = (SparseArraySegmentBase *)TVar4;
    if (index - *(uint *)TVar4 < *(Type *)((long)TVar4 + 8)) {
      return (SparseArraySegmentBase *)TVar4;
    }
  }
  this_00 = GetSegmentMap(this);
  if (this_00 == (SegmentBTreeRoot *)0x0 || !useSegmentMap) {
    if (TVar4 == (Type)0x0) {
      TVar4 = (Type)(this->head).ptr;
    }
  }
  else if ((((TVar4 == (Type)0x0) || (TVar1 = *(Type *)((long)TVar4 + 0x10), TVar1 == (Type)0x0)) ||
           ((*(uint *)TVar1 <= index &&
            (TVar4 = TVar1, *(Type *)((long)TVar1 + 8) <= index - *(uint *)TVar1)))) &&
          (SegmentBTreeRoot::Find
                     (this_00,index,&matchOrNextSeg,(SparseArraySegmentBase **)&local_38),
          TVar4 = (Type)matchOrNextSeg, matchOrNextSeg == (SparseArraySegmentBase *)0x0)) {
    TVar4 = local_38;
  }
  return (SparseArraySegmentBase *)TVar4;
}

Assistant:

SparseArraySegmentBase * JavascriptArray::GetBeginLookupSegment(uint32 index, const bool useSegmentMap) const
    {
        SparseArraySegmentBase *seg = nullptr;
        SparseArraySegmentBase * lastUsedSeg = this->GetLastUsedSegment();
        if (lastUsedSeg != nullptr && lastUsedSeg->left <= index)
        {
            seg = lastUsedSeg;
            if(index - lastUsedSeg->left < lastUsedSeg->size)
            {
                return seg;
            }
        }

        SegmentBTreeRoot * segmentMap = GetSegmentMap();
        if(!useSegmentMap || !segmentMap)
        {
            return seg ? seg : PointerValue(this->head);
        }

        if(seg)
        {
            // If indexes are being accessed sequentially, check the segment after the last-used segment before checking the
            // segment map, as it is likely to hit
            SparseArraySegmentBase *const nextSeg = seg->next;
            if(nextSeg)
            {
                if(index < nextSeg->left)
                {
                    return seg;
                }
                else if(index - nextSeg->left < nextSeg->size)
                {
                    return nextSeg;
                }
            }
        }

        SparseArraySegmentBase *matchOrNextSeg;
        segmentMap->Find(index, seg, matchOrNextSeg);
        return seg ? seg : matchOrNextSeg;
    }